

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O1

LY_ERR lysp_stmt_qnames(lysp_ctx *ctx,lysp_stmt *stmt,lysp_qname **qnames,yang_arg arg,
                       lysp_ext_instance **exts)

{
  lysp_qname *plVar1;
  long lVar2;
  lysp_stmt *stmt_00;
  bool bVar3;
  LY_ERR LVar4;
  undefined8 *puVar5;
  char *pcVar6;
  char *pcVar7;
  undefined4 in_register_0000000c;
  lysp_qname *str_p;
  uint64_t insubstmt_index;
  ly_ctx *plVar8;
  
  LVar4 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  plVar1 = *qnames;
  if (plVar1 == (lysp_qname *)0x0) {
    puVar5 = (undefined8 *)malloc(0x20);
    if (puVar5 != (undefined8 *)0x0) {
      *puVar5 = 1;
      goto LAB_0016e4f9;
    }
  }
  else {
    lVar2 = *(long *)&plVar1[-1].flags;
    *(long *)&plVar1[-1].flags = lVar2 + 1;
    puVar5 = (undefined8 *)realloc(&plVar1[-1].flags,lVar2 * 0x18 + 0x20);
    if (puVar5 != (undefined8 *)0x0) {
LAB_0016e4f9:
      *qnames = (lysp_qname *)(puVar5 + 1);
      bVar3 = true;
      LVar4 = LY_SUCCESS;
      goto LAB_0016e54a;
    }
    *(long *)&(*qnames)[-1].flags = *(long *)&(*qnames)[-1].flags + -1;
  }
  if (ctx == (lysp_ctx *)0x0) {
    plVar8 = (ly_ctx *)0x0;
  }
  else {
    plVar8 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  bVar3 = false;
  LVar4 = LY_EMEM;
  ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_qnames");
LAB_0016e54a:
  if (bVar3) {
    plVar1 = *qnames;
    lVar2 = *(long *)&plVar1[-1].flags;
    str_p = plVar1 + lVar2 + -1;
    str_p->str = (char *)0x0;
    str_p->mod = (lysp_module *)0x0;
    *(undefined8 *)&str_p->flags = 0;
    if (ctx == (lysp_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar4 = lydict_insert(plVar8,stmt->arg,0,&str_p->str);
    if (LVar4 == LY_SUCCESS) {
      plVar1[lVar2 + -1].mod =
           (lysp_module *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      for (stmt_00 = stmt->child; stmt_00 != (lysp_stmt *)0x0; stmt_00 = stmt_00->next) {
        if (stmt_00->kw != LY_STMT_EXTENSION_INSTANCE) {
          if (ctx == (lysp_ctx *)0x0) {
            plVar8 = (ly_ctx *)0x0;
          }
          else {
            plVar8 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar6 = lyplg_ext_stmt2str(stmt_00->kw);
          pcVar7 = lyplg_ext_stmt2str(stmt->kw);
          ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\"."
                  ,pcVar6,pcVar7);
          return LY_EVALID;
        }
        if (*qnames == (lysp_qname *)0x0) {
          insubstmt_index = 0xffffffffffffffff;
        }
        else {
          insubstmt_index = *(long *)&(*qnames)[-1].flags - 1;
        }
        LVar4 = lysp_stmt_ext(ctx,stmt_00,stmt->kw,insubstmt_index,
                              (lysp_ext_instance **)CONCAT44(in_register_0000000c,arg));
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
      }
      LVar4 = LY_SUCCESS;
    }
  }
  return LVar4;
}

Assistant:

static LY_ERR
lysp_stmt_qnames(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_qname **qnames, enum yang_arg arg,
        struct lysp_ext_instance **exts)
{
    struct lysp_qname *item;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, arg, stmt->arg));

    /* allocate new pointer */
    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *qnames, item, LY_EMEM);
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &item->str));
    item->mod = PARSER_CUR_PMOD(ctx);

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, LY_ARRAY_COUNT(*qnames) - 1, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(stmt->kw));
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}